

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

uint * Cec_ManComputeInitState(Gia_Man_t *pAig,int nFrames)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  Gia_ManRandom(1);
  iVar6 = 0;
  while ((iVar6 < pAig->nRegs &&
         (pGVar3 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar6),
         pGVar3 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff;
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  for (; iVar6 != nFrames; iVar6 = iVar6 + 1) {
    *(ulong *)pAig->pObjs = *(ulong *)pAig->pObjs & 0xbfffffffffffffff;
    iVar7 = 0;
    while ((iVar7 < pAig->vCis->nSize - pAig->nRegs &&
           (pGVar3 = Gia_ManCi(pAig,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar2 = Gia_ManRandom(0);
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff | (ulong)(uVar2 & 1) << 0x3e;
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < pAig->nObjs && (pGVar3 = Gia_ManObj(pAig,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar1 = *(ulong *)pGVar3;
      if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
        uVar2 = (uint)(uVar1 >> 0x20);
        *(ulong *)pGVar3 =
             uVar1 & 0xbfffffff7fffffff |
             ((ulong)((uVar2 >> 0x1d ^
                      (uint)((ulong)*(undefined8 *)(pGVar3 + -(ulong)(uVar2 & 0x1fffffff)) >> 0x3e))
                     & ((uint)((ulong)*(undefined8 *)(pGVar3 + -(uVar1 & 0x1fffffff)) >> 0x3e) ^
                       (uint)(uVar1 >> 0x1d) & 7)) & 1) << 0x3e;
      }
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while ((iVar7 < pAig->nRegs &&
           (pGVar3 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar7),
           pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar1 = *(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           uVar1 & 0xbfffffffffffffff |
           (uVar1 << 0x21 ^ *(ulong *)(pGVar3 + -(ulong)((uint)uVar1 & 0x1fffffff))) &
           0x4000000000000000;
      iVar7 = iVar7 + 1;
    }
    iVar7 = 0;
    while (((iVar7 < pAig->nRegs &&
            (pGVar3 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar7),
            pGVar3 != (Gia_Obj_t *)0x0)) &&
           (pGVar4 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar7),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xbfffffffffffffff | *(ulong *)pGVar3 & 0x4000000000000000;
      iVar7 = iVar7 + 1;
    }
  }
  uVar2 = pAig->nRegs;
  puVar5 = (uint *)calloc((long)(int)((((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0)),4);
  uVar8 = 0;
  while (((int)uVar8 < (int)uVar2 &&
         (pGVar3 = Gia_ManCi(pAig,(pAig->vCis->nSize - uVar2) + uVar8), pGVar3 != (Gia_Obj_t *)0x0))
        ) {
    if (((undefined1  [12])*pGVar3 & (undefined1  [12])0x4000000000000000) != (undefined1  [12])0x0)
    {
      puVar5[uVar8 >> 5] = puVar5[uVar8 >> 5] | 1 << ((byte)uVar8 & 0x1f);
    }
    uVar8 = uVar8 + 1;
    uVar2 = pAig->nRegs;
  }
  Gia_ManCleanMark1(pAig);
  return puVar5;
}

Assistant:

unsigned * Cec_ManComputeInitState( Gia_Man_t * pAig, int nFrames )
{  
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    unsigned * pInitState;
    int i, f; 
    Gia_ManRandom( 1 );
//    Abc_Print( 1, "Simulating %d timeframes.\n", nFrames );
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark1 = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManConst0(pAig)->fMark1 = 0;
        Gia_ManForEachPi( pAig, pObj, i )
            pObj->fMark1 = Gia_ManRandom(0) & 1;
        Gia_ManForEachAnd( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachRi( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMark1 = pObjRi->fMark1;
    }
    pInitState = ABC_CALLOC( unsigned, Abc_BitWordNum(Gia_ManRegNum(pAig)) );
    Gia_ManForEachRo( pAig, pObj, i )
    {
        if ( pObj->fMark1 )
            Abc_InfoSetBit( pInitState, i );
//        Abc_Print( 1, "%d", pObj->fMark1 );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManCleanMark1( pAig );
    return pInitState;
}